

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::TexImage2D::TexImage2D
          (TexImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint internalFormat,GLsizei width,GLsizei height,GLenum format,GLenum type,bool useSync,
          bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50 [2];
  undefined1 local_2a;
  undefined1 local_29;
  GLsizei local_28;
  bool serverSync_local;
  GLsizei GStack_24;
  bool useSync_local;
  GLsizei height_local;
  GLsizei width_local;
  GLint internalFormat_local;
  GLint level_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  TexImage2D *this_local;
  
  local_29 = useSync;
  local_2a = serverSync;
  local_28 = height;
  GStack_24 = width;
  height_local = internalFormat;
  width_local = level;
  _internalFormat_local = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"TexImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__TexImage2D_00670090;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  this->m_level = width_local;
  this->m_internalFormat = height_local;
  this->m_width = GStack_24;
  this->m_height = local_28;
  this->m_format = format;
  this->m_type = type;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (local_50,&this->m_texture);
  Operation::modifyGLObject(&this->super_Operation,local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_50);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pTVar1->isDefined = true;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&local_60);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&pTVar1->sourceImage,&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_60);
  return;
}

Assistant:

TexImage2D::TexImage2D (SharedPtr<Texture> texture, GLint level, GLint internalFormat, GLsizei width, GLsizei height, GLenum format, GLenum type, bool useSync, bool serverSync)
	: Operation			("TexImage2D", useSync, serverSync)
	, m_texture			(texture)
	, m_level			(level)
	, m_internalFormat	(internalFormat)
	, m_width			(width)
	, m_height			(height)
	, m_format			(format)
	, m_type			(type)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
	m_texture->isDefined = true;

	// Orphang texture
	texture->sourceImage = SharedPtr<EGLImage>();
}